

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8 * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  pointer pUVar6;
  long lVar7;
  pointer pUVar8;
  
  pUVar8 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar6 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pUVar6 - (long)pUVar8) >> 4)) {
    lVar7 = 0;
    do {
      if (pUVar8[lVar7].type_ == 3) {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        target[0] = '\v';
        target[1] = '\x10';
        uVar4 = pUVar8[lVar7].number_;
        if (uVar4 < 0x80) {
          target[2] = (byte)uVar4;
          puVar2 = target + 3;
        }
        else {
          target[2] = (byte)uVar4 | 0x80;
          if (uVar4 < 0x4000) {
            target[3] = (uint8)(uVar4 >> 7);
            puVar2 = target + 4;
          }
          else {
            puVar2 = target + 4;
            uVar4 = uVar4 >> 7;
            do {
              puVar3 = puVar2;
              puVar3[-1] = (byte)uVar4 | 0x80;
              uVar5 = uVar4 >> 7;
              puVar2 = puVar3 + 1;
              bVar1 = 0x3fff < uVar4;
              uVar4 = uVar5;
            } while (bVar1);
            *puVar3 = (uint8)uVar5;
          }
        }
        *puVar2 = '\x1a';
        puVar2 = UnknownField::InternalSerializeLengthDelimitedNoTag
                           (pUVar8 + lVar7,puVar2 + 1,stream);
        if (stream->end_ <= puVar2) {
          puVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
        }
        *puVar2 = '\f';
        target = puVar2 + 1;
        pUVar8 = (unknown_fields->fields_).
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pUVar6 = (unknown_fields->fields_).
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)pUVar6 - (long)pUVar8) >> 4));
  }
  return target;
}

Assistant:

uint8* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      stream->EnsureSpace(&target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      stream->EnsureSpace(&target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}